

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_codecvt.cpp
# Opt level: O2

char * res(result r)

{
  if (r < 4) {
    return &DAT_00108550 + *(int *)(&DAT_00108550 + (ulong)r * 4);
  }
  return "error";
}

Assistant:

char const *res(std::codecvt_base::result r)
{
    switch(r){
    case std::codecvt_base::ok: return "ok";
    case std::codecvt_base::partial: return "partial";
    case std::codecvt_base::error: return "error";
    case std::codecvt_base::noconv: return "noconv";
    default:
        return "error";
    }
}